

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::Generator::
GetResolvedFeatures<google::protobuf::EnumValueDescriptor>
          (string *__return_storage_ptr__,Generator *this,EnumValueDescriptor *descriptor)

{
  FileDescriptor *pFVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  DynamicMessageFactory *pDVar6;
  Arena *pAVar7;
  vector *pvVar8;
  long lVar9;
  EnumDescriptor *descriptor_00;
  Message *extraout_RDX;
  undefined8 uVar10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_args;
  AlphaNum local_1a0;
  DynamicMessageFactory *local_170;
  string *local_168;
  code *local_160;
  string local_158;
  long local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  long *local_108;
  char local_100 [8];
  long local_f8 [2];
  AlphaNum *local_e8;
  Generator *local_e0;
  Message *local_d8;
  string local_d0;
  undefined1 local_b0 [80];
  AlphaNum local_60;
  
  bVar4 = GeneratingDescriptorProto(this);
  if (bVar4) {
    pFVar1 = this->file_;
    lVar5 = google::protobuf::FeatureSet::GetMetadata();
    lVar5 = google::protobuf::FileDescriptor::FindMessageTypeByName
                      (pFVar1,(*(undefined8 **)(lVar5 + 8))[1],**(undefined8 **)(lVar5 + 8));
    if (lVar5 == 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/python/generator.cc"
                 ,0x1d7,0x16,"feature_set != nullptr");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (&local_1a0,0x2b,"Malformed descriptor.proto doesn\'t contain ");
      lVar5 = google::protobuf::FeatureSet::GetMetadata();
      absl::lts_20240722::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_1a0,(string *)(*(long *)(lVar5 + 8) + 0x20));
LAB_003063f6:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1a0);
    }
    pDVar6 = (DynamicMessageFactory *)operator_new(0x40);
    google::protobuf::DynamicMessageFactory::DynamicMessageFactory(pDVar6);
    pAVar7 = (Arena *)(**(code **)(*(long *)pDVar6 + 0x10))(pDVar6,lVar5);
    pvVar8 = (vector *)google::protobuf::MessageLite::New(pAVar7);
    google::protobuf::MessageLite::SerializeAsString_abi_cxx11_();
    google::protobuf::MessageLite::ParseFromString
              (pvVar8,local_1a0.piece_._M_str,local_1a0.piece_._M_len);
    if ((char *)local_1a0.piece_._M_len != local_1a0.digits_) {
      operator_delete((void *)local_1a0.piece_._M_len,local_1a0.digits_._0_8_ + 1);
    }
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    google::protobuf::Message::GetMetadata();
    local_158.field_2._M_allocated_capacity = 0;
    local_158.field_2._8_8_ = (long *)0x0;
    local_138 = 0;
    local_170 = pDVar6;
    local_e8 = (AlphaNum *)__return_storage_ptr__;
    local_e0 = this;
    local_d8 = extraout_RDX;
    google::protobuf::Reflection::ListFields(extraout_RDX,pvVar8);
    uVar3 = local_158.field_2._8_8_;
    if (local_158.field_2._M_allocated_capacity != local_158.field_2._8_8_) {
      uVar10 = local_158.field_2._M_allocated_capacity;
      do {
        lVar5 = *(long *)uVar10;
        lVar9 = google::protobuf::FieldDescriptor::enum_type();
        if (lVar9 == 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/python/generator.cc"
                     ,0x1e9,0x1d,"field->enum_type() != nullptr");
          absl::lts_20240722::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                    (&local_1a0,0x20,"Unexpected non-enum field found!");
          goto LAB_003063f6;
        }
        if (*(int *)(*(long *)(lVar5 + 0x38) + 0x90) != 2) {
          descriptor_00 = (EnumDescriptor *)google::protobuf::FieldDescriptor::enum_type();
          google::protobuf::Reflection::GetEnumValue(local_d8,(FieldDescriptor *)pvVar8);
          lVar9 = google::protobuf::EnumDescriptor::FindValueByNumber((int)descriptor_00);
          puVar2 = *(undefined8 **)(lVar5 + 8);
          local_1a0.piece_._M_str = (char *)*puVar2;
          local_1a0.piece_._M_len = puVar2[1];
          local_60.piece_._M_len = 1;
          local_60.piece_._M_str = "=";
          ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                    (&local_d0,local_e0,descriptor_00);
          local_158._M_dataplus._M_p = *(pointer *)(lVar9 + 8);
          local_160 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                      Dispatch<std::__cxx11::string>;
          local_158._M_string_length =
               (size_type)
               absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::__cxx11::string>;
          local_168 = &local_d0;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_108,"%s.values_by_name[\"%s\"].number",0x1e,&local_168,2);
          local_b0[0x20] = local_100[0];
          local_b0[0x21] = local_100[1];
          local_b0[0x22] = local_100[2];
          local_b0[0x23] = local_100[3];
          local_b0[0x24] = local_100[4];
          local_b0[0x25] = local_100[5];
          local_b0[0x26] = local_100[6];
          local_b0[0x27] = local_100[7];
          local_b0._40_8_ = local_108;
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b0,&local_1a0,&local_60);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0)
          ;
          if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
            operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
          }
          if (local_108 != local_f8) {
            operator_delete(local_108,local_f8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        uVar10 = uVar10 + 8;
      } while (uVar10 != uVar3);
    }
    local_1a0.piece_._M_len = 0x12;
    local_1a0.piece_._M_str = "_ResolvedFeatures(";
    absl::lts_20240722::strings_internal::
    JoinAlgorithm<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              (&local_168,
               (strings_internal *)
               local_128.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_128.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,1,",");
    __return_storage_ptr__ = (string *)local_e8;
    pDVar6 = local_170;
    local_60.piece_._M_len = (size_t)local_160;
    local_60.piece_._M_str = (char *)local_168;
    local_b0[0x20] = '\x01';
    local_b0[0x21] = '\0';
    local_b0[0x22] = '\0';
    local_b0[0x23] = '\0';
    local_b0[0x24] = '\0';
    local_b0[0x25] = '\0';
    local_b0[0x26] = '\0';
    local_b0[0x27] = '\0';
    local_b0._40_8_ = ")";
    absl::lts_20240722::StrCat_abi_cxx11_(local_e8,&local_1a0,&local_60);
    if (local_168 != &local_158) {
      operator_delete(local_168,(ulong)(local_158._M_dataplus._M_p + 1));
    }
    if ((long *)local_158.field_2._M_allocated_capacity != (long *)0x0) {
      operator_delete((void *)local_158.field_2._M_allocated_capacity,
                      local_138 - local_158.field_2._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    (**(code **)(*(long *)pvVar8 + 8))(pvVar8);
    (**(code **)(*(long *)pDVar6 + 8))(pDVar6);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"None","");
  }
  return (string *)(AlphaNum *)__return_storage_ptr__;
}

Assistant:

std::string Generator::GetResolvedFeatures(
    const DescriptorT& descriptor) const {
  if (!GeneratingDescriptorProto()) {
    // Everything but descriptor.proto can handle proper feature resolution.
    return "None";
  }

  // Load the resolved features from our pool.
  const Descriptor* feature_set =
      file_->FindMessageTypeByName(FeatureSet::GetDescriptor()->name());
  ABSL_CHECK(feature_set != nullptr)
      << "Malformed descriptor.proto doesn't contain "
      << FeatureSet::GetDescriptor()->full_name();
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  auto features =
      absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
  features->ParseFromString(
      GetResolvedSourceFeatures(descriptor).SerializeAsString());

  // Collect all of the resolved features.
  std::vector<std::string> feature_args;
  const Reflection* reflection = features->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*features, &fields);
  for (const auto* field : fields) {
    // Assume these are all enums.  If we add non-enum global features or any
    // python-specific features, we will need to come back and improve this
    // logic.
    ABSL_CHECK(field->enum_type() != nullptr)
        << "Unexpected non-enum field found!";
    if (field->options().retention() == FieldOptions::RETENTION_SOURCE) {
      // Skip any source-retention features.
      continue;
    }
    const EnumDescriptor* enm = field->enum_type();
    const EnumValueDescriptor* value =
        enm->FindValueByNumber(reflection->GetEnumValue(*features, field));

    feature_args.emplace_back(absl::StrCat(
        field->name(), "=",
        absl::StrFormat("%s.values_by_name[\"%s\"].number",
                        ModuleLevelDescriptorName(*enm), value->name())));
  }
  return absl::StrCat("_ResolvedFeatures(", absl::StrJoin(feature_args, ","),
                      ")");
}